

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O0

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getCurrentState(DynamicalSystemSimulator *this)

{
  uint time;
  Index extraout_RDX;
  long in_RSI;
  Vector VVar1;
  Matrix<double,__1,__1,_0,__1,__1> local_30;
  DynamicalSystemSimulator *this_local;
  
  this_local = this;
  time = IndexedMatrixArray::getLastIndex((IndexedMatrixArray *)(in_RSI + 0x10));
  IndexedMatrixArray::operator[]((Matrix *)&local_30,(IndexedMatrixArray *)(in_RSI + 0x10),time);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_30);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_30);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector DynamicalSystemSimulator::getCurrentState() const
    {
        return x_[x_.getLastIndex()];
    }